

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaAttributeGroupPtr_conflict
xmlSchemaParseAttributeGroupDefinition
          (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlNodePtr node)

{
  xmlSchemaPtr ctxt;
  int iVar1;
  xmlAttrPtr attr_00;
  xmlSchemaTypePtr type;
  _xmlNode *p_Var2;
  xmlSchemaWildcardPtr pxVar3;
  int local_4c;
  int res;
  int hasRefs;
  xmlAttrPtr attr;
  xmlNodePtr child;
  xmlSchemaAttributeGroupPtr_conflict ret;
  xmlChar *name;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  attr = (xmlAttrPtr)0x0;
  local_4c = 0;
  if (((pctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) ||
     (node == (xmlNodePtr)0x0)) {
    pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    name = (xmlChar *)node;
    node_local = (xmlNodePtr)schema;
    schema_local = (xmlSchemaPtr)pctxt;
    attr_00 = xmlSchemaGetPropNode(node,"name");
    ctxt = schema_local;
    _res = attr_00;
    if (attr_00 == (xmlAttrPtr)0x0) {
      xmlSchemaPMissingAttrErr
                ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_MISSING,
                 (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)name,"name",(char *)0x0);
      pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
    }
    else {
      type = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
      iVar1 = xmlSchemaPValAttrNode
                        ((xmlSchemaParserCtxtPtr)ctxt,(xmlSchemaBasicItemPtr)0x0,attr_00,type,
                         (xmlChar **)&ret);
      if (iVar1 == 0) {
        child = (xmlNodePtr)
                xmlSchemaAddAttributeGroupDefinition
                          ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                           (xmlChar *)ret,(xmlChar *)schema_local[1].annot,(xmlNodePtr)name);
        if (child == (xmlNodePtr)0x0) {
          pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
        }
        else {
          for (_res = *(_xmlAttr **)(name + 0x58); _res != (_xmlAttr *)0x0; _res = _res->next) {
            if (_res->ns == (xmlNs *)0x0) {
              iVar1 = xmlStrEqual(_res->name,"name");
              if ((iVar1 == 0) && (iVar1 = xmlStrEqual(_res->name,"id"), iVar1 == 0)) {
                xmlSchemaPIllegalAttrErr
                          ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                           (xmlSchemaBasicItemPtr)0x0,_res);
              }
            }
            else {
              iVar1 = xmlStrEqual(_res->ns->href,xmlSchemaNs);
              if (iVar1 != 0) {
                xmlSchemaPIllegalAttrErr
                          ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                           (xmlSchemaBasicItemPtr)0x0,_res);
              }
            }
          }
          xmlSchemaPValAttrID((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)name,"id");
          attr = *(xmlAttrPtr *)(name + 0x18);
          if (((attr != (xmlAttrPtr)0x0) && (attr->ns != (xmlNs *)0x0)) &&
             ((iVar1 = xmlStrEqual(attr->name,(xmlChar *)"annotation"), iVar1 != 0 &&
              (iVar1 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar1 != 0)))) {
            p_Var2 = (_xmlNode *)
                     xmlSchemaParseAnnotation
                               ((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)attr,1);
            child->next = p_Var2;
            attr = attr->next;
          }
          iVar1 = xmlSchemaParseLocalAttributes
                            ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                             (xmlNodePtr *)&attr,(xmlSchemaItemListPtr *)&child->line,0x10,&local_4c
                            );
          if (local_4c != 0) {
            *(uint *)&child->ns = *(uint *)&child->ns | 0x10;
          }
          if (iVar1 == -1) {
            pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
          }
          else {
            if ((((attr != (xmlAttrPtr)0x0) && (attr->ns != (xmlNs *)0x0)) &&
                (iVar1 = xmlStrEqual(attr->name,(xmlChar *)"anyAttribute"), iVar1 != 0)) &&
               (iVar1 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar1 != 0)) {
              pxVar3 = xmlSchemaParseAnyAttribute
                                 ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                                  (xmlNodePtr)attr);
              child->content = (xmlChar *)pxVar3;
              attr = attr->next;
            }
            if (attr != (xmlAttrPtr)0x0) {
              xmlSchemaPContentErr
                        ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
                         (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)name,(xmlNodePtr)attr,(char *)0x0,
                         "(annotation?, ((attribute | attributeGroup)*, anyAttribute?))");
            }
            pctxt_local = (xmlSchemaParserCtxtPtr)child;
          }
        }
      }
      else {
        pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
      }
    }
  }
  return (xmlSchemaAttributeGroupPtr_conflict)pctxt_local;
}

Assistant:

static xmlSchemaAttributeGroupPtr
xmlSchemaParseAttributeGroupDefinition(xmlSchemaParserCtxtPtr pctxt,
				       xmlSchemaPtr schema,
				       xmlNodePtr node)
{
    const xmlChar *name;
    xmlSchemaAttributeGroupPtr ret;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    int hasRefs = 0;
    int res;

    if ((pctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    attr = xmlSchemaGetPropNode(node, "name");
    if (attr == NULL) {
	xmlSchemaPMissingAttrErr(pctxt,
	    XML_SCHEMAP_S4S_ATTR_MISSING,
	    NULL, node, "name", NULL);
	return (NULL);
    }
    /*
    * The name is crucial, exit if invalid.
    */
    if (xmlSchemaPValAttrNode(pctxt,
	NULL, attr,
	xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0) {
	return (NULL);
    }
    ret = xmlSchemaAddAttributeGroupDefinition(pctxt, schema,
	name, pctxt->targetNamespace, node);
    if (ret == NULL)
	return (NULL);
    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "id")))
	    {
		xmlSchemaPIllegalAttrErr(pctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(pctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    /* Attribute ID */
    xmlSchemaPValAttrID(pctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        ret->annot = xmlSchemaParseAnnotation(pctxt, child, 1);
        child = child->next;
    }
    /*
    * Parse contained attribute decls/refs.
    */
    res = xmlSchemaParseLocalAttributes(pctxt, schema, &child,
	(xmlSchemaItemListPtr *) &(ret->attrUses),
	XML_SCHEMA_TYPE_ATTRIBUTEGROUP, &hasRefs);
    if (hasRefs)
	ret->flags |= XML_SCHEMAS_ATTRGROUP_HAS_REFS;
    if (res == -1)
	return(NULL);
    /*
    * Parse the attribute wildcard.
    */
    if (IS_SCHEMA(child, "anyAttribute")) {
	ret->attributeWildcard = xmlSchemaParseAnyAttribute(pctxt,
	    schema, child);
	child = child->next;
    }
    if (child != NULL) {
	xmlSchemaPContentErr(pctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child, NULL,
	    "(annotation?, ((attribute | attributeGroup)*, anyAttribute?))");
    }
    return (ret);
}